

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O1

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_019ad630;
  iVar1 = (cp->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow =
       (cp->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol =
       iVar1;
  cVar2 = (cp->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
          fDefPositive;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed
       = (cp->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
         fDecomposed;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  fDefPositive = cVar2;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontMatrix_019a8158;
  TPZFileEqnStorage<float>::TPZFileEqnStorage(&this->fStorage,&cp->fStorage);
  TPZFrontNonSym<float>::TPZFrontNonSym(&this->fFront,&cp->fFront);
  iVar1 = cp->fLastDecomposed;
  this->fNumEq = cp->fNumEq;
  this->fLastDecomposed = iVar1;
  TPZVec<int>::TPZVec(&this->fNumElConnected,&cp->fNumElConnected);
  TPZVec<int>::TPZVec(&this->fNumElConnectedBackup,&cp->fNumElConnectedBackup);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }